

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_video_source.h
# Opt level: O2

void __thiscall libaom_test::Y4mVideoSource::~Y4mVideoSource(Y4mVideoSource *this)

{
  (this->super_VideoSource)._vptr_VideoSource = (_func_int **)&PTR__Y4mVideoSource_00ee4808;
  aom_img_free((this->img_)._M_t.super___uniq_ptr_impl<aom_image,_std::default_delete<aom_image>_>.
               _M_t.super__Tuple_impl<0UL,_aom_image_*,_std::default_delete<aom_image>_>.
               super__Head_base<0UL,_aom_image_*,_false>._M_head_impl);
  CloseSource(this);
  std::unique_ptr<aom_image,_std::default_delete<aom_image>_>::~unique_ptr(&this->img_);
  std::__cxx11::string::~string((string *)&this->file_name_);
  return;
}

Assistant:

~Y4mVideoSource() override {
    aom_img_free(img_.get());
    CloseSource();
  }